

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

int secp256k1_fe_is_square_var(secp256k1_fe *x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  uint64_t uVar302;
  uint64_t uVar303;
  uint64_t uVar304;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uint64_t a4;
  secp256k1_gej *psVar305;
  secp256k1_gej *psVar306;
  ulong uVar307;
  void *pvVar308;
  byte bVar309;
  int iVar310;
  int iVar311;
  ulong uVar312;
  secp256k1_gej *a;
  uint uVar313;
  ulong uVar314;
  ulong uVar315;
  long unaff_RBP;
  int iVar316;
  secp256k1_gej *in_RSI;
  ulong uVar317;
  secp256k1_gej *psVar318;
  secp256k1_gej *psVar319;
  secp256k1_gej *psVar320;
  uint64_t *puVar321;
  ulong uVar322;
  uint64_t *puVar323;
  secp256k1_gej *psVar324;
  int iVar325;
  secp256k1_gej *psVar326;
  secp256k1_gej *unaff_R12;
  secp256k1_gej *unaff_R13;
  secp256k1_gej *psVar327;
  secp256k1_gej *psVar328;
  long lVar329;
  secp256k1_gej *unaff_R14;
  secp256k1_gej *psVar330;
  secp256k1_fe *b;
  secp256k1_modinv64_modinfo *unaff_R15;
  secp256k1_modinv64_signed62 f;
  secp256k1_fe sqrt;
  secp256k1_fe tmp;
  secp256k1_ge sStack_648;
  secp256k1_ge sStack_5e0;
  secp256k1_gej sStack_578;
  secp256k1_gej *psStack_4e0;
  secp256k1_gej *psStack_4d8;
  secp256k1_gej *psStack_4d0;
  secp256k1_gej *psStack_4c8;
  secp256k1_gej *psStack_4c0;
  secp256k1_gej *psStack_4b0;
  secp256k1_gej *psStack_4a8;
  ulong uStack_4a0;
  secp256k1_gej *psStack_498;
  secp256k1_fe *psStack_490;
  secp256k1_gej *psStack_488;
  secp256k1_gej *psStack_480;
  secp256k1_gej *psStack_478;
  ulong uStack_470;
  secp256k1_gej *psStack_468;
  secp256k1_gej *psStack_460;
  secp256k1_gej *psStack_458;
  secp256k1_gej *psStack_450;
  secp256k1_gej *psStack_448;
  secp256k1_gej *psStack_440;
  undefined1 auStack_438 [56];
  uint64_t uStack_400;
  uint64_t uStack_3f8;
  uint64_t uStack_3f0;
  uint64_t uStack_3e8;
  uint uStack_3e0;
  undefined1 auStack_3d8 [56];
  uint64_t uStack_3a0;
  uint64_t uStack_398;
  uint64_t uStack_390;
  uint64_t uStack_388;
  int iStack_380;
  undefined1 auStack_378 [56];
  uint64_t uStack_340;
  uint64_t uStack_338;
  uint64_t uStack_330;
  uint64_t uStack_328;
  int iStack_320;
  int iStack_31c;
  ulong uStack_310;
  undefined1 auStack_308 [56];
  secp256k1_gej *psStack_2d0;
  secp256k1_gej *psStack_2c8;
  secp256k1_gej *psStack_2c0;
  ulong uStack_2b8;
  ulong uStack_2b0;
  undefined1 auStack_2a8 [64];
  ulong uStack_268;
  ulong uStack_260;
  ulong uStack_258;
  long lStack_250;
  uint64_t uStack_248;
  secp256k1_fe sStack_240;
  secp256k1_gej *psStack_210;
  secp256k1_gej *psStack_208;
  secp256k1_gej *psStack_200;
  secp256k1_fe *psStack_1f8;
  secp256k1_gej *psStack_1f0;
  secp256k1_gej *psStack_1e8;
  ulong uStack_1d8;
  secp256k1_gej *psStack_1d0;
  ulong uStack_1c8;
  undefined1 auStack_1c0 [56];
  uint64_t uStack_188;
  uint64_t uStack_180;
  uint64_t uStack_178;
  uint64_t uStack_170;
  int iStack_168;
  int iStack_164;
  secp256k1_gej *psStack_158;
  secp256k1_gej *psStack_150;
  secp256k1_gej *psStack_148;
  secp256k1_gej *psStack_140;
  secp256k1_gej *psStack_138;
  code *pcStack_130;
  ulong local_120;
  secp256k1_gej *local_118;
  undefined1 local_110 [40];
  undefined1 local_e8 [104];
  secp256k1_gej *local_80;
  secp256k1_gej *local_78;
  secp256k1_gej *local_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  int iStack_40;
  int iStack_3c;
  
  local_68 = x->n[0];
  uStack_60 = x->n[1];
  local_58 = x->n[2];
  uStack_50 = x->n[3];
  local_48 = x->n[4];
  iStack_40 = x->magnitude;
  iStack_3c = x->normalized;
  pcStack_130 = (code *)0x122f0e;
  secp256k1_fe_verify(x);
  local_e8._48_8_ = x->n[0];
  local_e8._56_8_ = x->n[1];
  local_e8._64_8_ = x->n[2];
  local_e8._72_8_ = x->n[3];
  local_e8._80_8_ = x->n[4];
  local_e8._88_4_ = x->magnitude;
  local_e8._92_4_ = x->normalized;
  psVar318 = (secp256k1_gej *)(local_e8 + 0x30);
  pcStack_130 = (code *)0x122f31;
  secp256k1_fe_normalize_var((secp256k1_fe *)psVar318);
  pcStack_130 = (code *)0x122f39;
  psVar319 = psVar318;
  secp256k1_fe_verify((secp256k1_fe *)psVar318);
  if (local_e8._92_4_ == 0) {
LAB_001234da:
    pcStack_130 = (code *)0x1234df;
    secp256k1_fe_is_square_var_cold_19();
LAB_001234df:
    pcStack_130 = (code *)0x1234e4;
    secp256k1_fe_is_square_var_cold_17();
  }
  else {
    if (((local_e8._64_8_ == 0 && local_e8._72_8_ == 0) &&
        (local_e8._56_8_ == 0 && local_e8._48_8_ == 0)) && local_e8._80_8_ == 0) {
      psVar318 = (secp256k1_gej *)0x1;
    }
    else {
      local_110._0_8_ = (local_e8._56_8_ << 0x34 | local_e8._48_8_) & 0x3fffffffffffffff;
      local_110._8_8_ =
           (ulong)((uint)local_e8._64_8_ & 0xfffff) << 0x2a | (ulong)local_e8._56_8_ >> 10;
      local_110._16_8_ =
           (ulong)((uint)local_e8._72_8_ & 0x3fffffff) << 0x20 | (ulong)local_e8._64_8_ >> 0x14;
      psVar319 = (secp256k1_gej *)
                 ((local_e8._80_8_ & 0xffffffffff) << 0x16 | (ulong)local_e8._72_8_ >> 0x1e);
      local_110._32_8_ = (ulong)local_e8._80_8_ >> 0x28;
      local_e8._16_8_ = 0;
      local_e8._24_8_ = 0;
      local_e8._0_8_ = -0x1000003d1;
      local_e8._8_8_ = 0;
      local_e8._32_8_ = 0x100;
      in_RSI = (secp256k1_gej *)(local_110._8_8_ | local_110._0_8_);
      local_110._24_8_ = psVar319;
      if (((local_110._32_8_ == 0 && local_110._16_8_ == 0) && in_RSI == (secp256k1_gej *)0x0) &&
          psVar319 == (secp256k1_gej *)0x0) goto LAB_001234df;
      unaff_R14 = (secp256k1_gej *)0x5;
      unaff_RBP = -1;
      uVar322 = 0;
      unaff_R13 = (secp256k1_gej *)0xfffffffefffffc2f;
      psVar318 = (secp256k1_gej *)0x0;
      do {
        psVar319 = (secp256k1_gej *)(local_e8._8_8_ << 0x3e | (ulong)unaff_R13);
        puVar321 = (uint64_t *)(local_110._8_8_ << 0x3e | local_110._0_8_);
        psVar305 = (secp256k1_gej *)0x0;
        psVar327 = (secp256k1_gej *)0x0;
        unaff_R13 = (secp256k1_gej *)0x1;
        iVar311 = 0x3e;
        psVar330 = (secp256k1_gej *)0x1;
        puVar323 = puVar321;
        psVar320 = psVar319;
        unaff_R12 = psVar318;
        while( true ) {
          uVar317 = -1L << ((byte)iVar311 & 0x3f) | (ulong)puVar323;
          lVar329 = 0;
          if (uVar317 != 0) {
            for (; (uVar317 >> lVar329 & 1) == 0; lVar329 = lVar329 + 1) {
            }
          }
          bVar309 = (byte)lVar329;
          psVar324 = (secp256k1_gej *)((ulong)puVar323 >> (bVar309 & 0x3f));
          psVar330 = (secp256k1_gej *)((long)psVar330 << (bVar309 & 0x3f));
          psVar305 = (secp256k1_gej *)((long)psVar305 << (bVar309 & 0x3f));
          unaff_RBP = unaff_RBP - lVar329;
          in_RSI = (secp256k1_gej *)((ulong)psVar320 >> 2);
          uVar313 = ((uint)((ulong)psVar320 >> 1) ^ (uint)in_RSI) & (uint)lVar329 ^ (uint)unaff_R12;
          psVar318 = (secp256k1_gej *)(ulong)uVar313;
          iVar311 = iVar311 - (uint)lVar329;
          local_120 = uVar322;
          local_118 = unaff_R14;
          if (iVar311 == 0) break;
          if (((ulong)psVar320 & 1) == 0) {
            pcStack_130 = (code *)0x12348f;
            secp256k1_fe_is_square_var_cold_7();
LAB_0012348f:
            pcStack_130 = (code *)0x123494;
            secp256k1_fe_is_square_var_cold_6();
LAB_00123494:
            pcStack_130 = (code *)0x123499;
            secp256k1_fe_is_square_var_cold_1();
LAB_00123499:
            pcStack_130 = (code *)0x12349e;
            secp256k1_fe_is_square_var_cold_2();
            goto LAB_0012349e;
          }
          if (((ulong)psVar324 & 1) == 0) goto LAB_0012348f;
          in_RSI = (secp256k1_gej *)
                   ((long)psVar305 * (long)puVar321 + (long)psVar330 * (long)psVar319);
          bVar309 = 0x3e - (char)iVar311;
          unaff_R15 = (secp256k1_modinv64_modinfo *)((long)psVar320 << (bVar309 & 0x3f));
          if (in_RSI != (secp256k1_gej *)unaff_R15) goto LAB_00123494;
          unaff_R15 = (secp256k1_modinv64_modinfo *)
                      ((long)unaff_R13 * (long)puVar321 + (long)psVar327 * (long)psVar319);
          in_RSI = (secp256k1_gej *)((long)psVar324 << (bVar309 & 0x3f));
          if ((secp256k1_gej *)unaff_R15 != in_RSI) goto LAB_00123499;
          iVar325 = (int)psVar320;
          iVar316 = (int)psVar324;
          if (unaff_RBP < 0) {
            unaff_RBP = -unaff_RBP;
            iVar310 = (int)unaff_RBP + 1;
            if (iVar311 <= iVar310) {
              iVar310 = iVar311;
            }
            in_RSI = (secp256k1_gej *)(ulong)(iVar310 - 0x3fU);
            if (0xffffffc1 < iVar310 - 0x3fU) {
              psVar318 = (secp256k1_gej *)
                         (ulong)(uVar313 ^ (uint)(((ulong)psVar324 & (ulong)psVar320) >> 1));
              unaff_R15 = (secp256k1_modinv64_modinfo *)
                          ((ulong)(0x3fL << (-(char)iVar310 & 0x3fU)) >> (-(char)iVar310 & 0x3fU));
              uVar313 = (iVar316 * iVar316 + 0x3e) * iVar316 * iVar325 & (uint)unaff_R15;
              psVar306 = psVar305;
              psVar305 = unaff_R13;
              in_RSI = psVar330;
              psVar326 = psVar320;
              psVar320 = psVar324;
              psVar330 = psVar327;
              goto LAB_001231c3;
            }
            goto LAB_001234a8;
          }
          iVar310 = (int)unaff_RBP + 1;
          if (iVar311 <= iVar310) {
            iVar310 = iVar311;
          }
          in_RSI = (secp256k1_gej *)(ulong)(iVar310 - 0x3fU);
          if (iVar310 - 0x3fU < 0xffffffc2) goto LAB_001234a3;
          unaff_R15 = (secp256k1_modinv64_modinfo *)
                      ((ulong)(0xfL << (-(char)iVar310 & 0x3fU)) >> (-(char)iVar310 & 0x3fU));
          uVar313 = -(iVar316 * ((iVar325 * 2 + 2U & 8) + iVar325)) & (uint)unaff_R15;
          psVar306 = unaff_R13;
          in_RSI = psVar327;
          psVar326 = psVar324;
LAB_001231c3:
          uVar317 = (ulong)uVar313;
          puVar323 = (uint64_t *)((long)(psVar326->x).n + uVar317 * (long)psVar320);
          psVar327 = (secp256k1_gej *)((long)(in_RSI->x).n + (long)psVar330 * uVar317);
          unaff_R13 = (secp256k1_gej *)((long)(psVar306->x).n + uVar317 * (long)psVar305);
          unaff_R12 = psVar318;
          if (((ulong)puVar323 & (ulong)unaff_R15) != 0) {
LAB_0012349e:
            pcStack_130 = (code *)0x1234a3;
            secp256k1_fe_is_square_var_cold_4();
LAB_001234a3:
            pcStack_130 = (code *)0x1234a8;
            secp256k1_fe_is_square_var_cold_3();
LAB_001234a8:
            pcStack_130 = (code *)0x1234ad;
            secp256k1_fe_is_square_var_cold_5();
            goto LAB_001234ad;
          }
        }
        psVar319 = (secp256k1_gej *)((long)psVar305 * (long)psVar327);
        lVar329 = (long)psVar330 * (long)unaff_R13 - (long)psVar319;
        uVar322 = (ulong)((secp256k1_gej *)((long)psVar330 * (long)unaff_R13) < psVar319);
        uVar317 = SUB168(SEXT816((long)psVar330) * SEXT816((long)unaff_R13),8) -
                  SUB168(SEXT816((long)psVar305) * SEXT816((long)psVar327),8);
        unaff_R15 = &secp256k1_const_modinfo_fe;
        unaff_R12 = (secp256k1_gej *)local_e8;
        local_e8._96_8_ = psVar330;
        local_80 = psVar305;
        local_78 = psVar327;
        local_70 = unaff_R13;
        if ((lVar329 != 0x4000000000000000 || uVar317 != uVar322) &&
           (uVar317 - uVar322 != -1 || lVar329 != -0x4000000000000000)) {
LAB_001234ad:
          pcStack_130 = (code *)0x1234b2;
          secp256k1_fe_is_square_var_cold_16();
          unaff_R14 = psVar330;
LAB_001234b2:
          pcStack_130 = (code *)0x1234b7;
          secp256k1_fe_is_square_var_cold_15();
LAB_001234b7:
          pcStack_130 = (code *)0x1234bc;
          secp256k1_fe_is_square_var_cold_14();
LAB_001234bc:
          pcStack_130 = (code *)0x1234c1;
          secp256k1_fe_is_square_var_cold_13();
LAB_001234c1:
          pcStack_130 = (code *)0x1234c6;
          secp256k1_fe_is_square_var_cold_12();
LAB_001234c6:
          pcStack_130 = (code *)0x1234cb;
          secp256k1_fe_is_square_var_cold_11();
LAB_001234cb:
          pcStack_130 = (code *)0x1234d0;
          secp256k1_fe_is_square_var_cold_10();
LAB_001234d0:
          pcStack_130 = (code *)0x1234d5;
          secp256k1_fe_is_square_var_cold_9();
LAB_001234d5:
          pcStack_130 = (code *)0x1234da;
          secp256k1_fe_is_square_var_cold_8();
          goto LAB_001234da;
        }
        iVar316 = (int)unaff_R14;
        pcStack_130 = (code *)0x12326e;
        in_RSI = unaff_R14;
        psVar319 = unaff_R12;
        iVar311 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar316,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar311 < 1) goto LAB_001234b2;
        pcStack_130 = (code *)0x123289;
        in_RSI = unaff_R14;
        psVar319 = unaff_R12;
        iVar311 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar316,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (0 < iVar311) goto LAB_001234b7;
        unaff_R13 = (secp256k1_gej *)local_110;
        pcStack_130 = (code *)0x1232a6;
        in_RSI = unaff_R14;
        psVar319 = unaff_R13;
        iVar311 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R13,iVar316,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar311 < 1) goto LAB_001234bc;
        pcStack_130 = (code *)0x1232c1;
        in_RSI = unaff_R14;
        psVar319 = unaff_R13;
        iVar311 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R13,iVar316,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (-1 < iVar311) goto LAB_001234c1;
        pcStack_130 = (code *)0x1232df;
        secp256k1_modinv64_update_fg_62_var
                  (iVar316,(secp256k1_modinv64_signed62 *)unaff_R12,
                   (secp256k1_modinv64_signed62 *)unaff_R13,
                   (secp256k1_modinv64_trans2x2 *)(local_e8 + 0x60));
        unaff_R13 = (secp256k1_gej *)local_e8._0_8_;
        if ((secp256k1_gej *)local_e8._0_8_ == (secp256k1_gej *)0x1) {
          if (1 < iVar316) {
            psVar319 = (secp256k1_gej *)0x1;
            uVar322 = 0;
            do {
              uVar322 = uVar322 | *(ulong *)(local_e8 + (long)psVar319 * 8);
              psVar319 = (secp256k1_gej *)((long)(psVar319->x).n + 1);
            } while (unaff_R14 != psVar319);
            if (uVar322 != 0) goto LAB_00123314;
          }
          psVar318 = (secp256k1_gej *)(ulong)(~uVar313 & 1);
          goto LAB_001233cb;
        }
LAB_00123314:
        lVar329 = (long)iVar316;
        if ((-1 < lVar329 + -2 && *(long *)(local_e8 + lVar329 * 8 + -8) == 0) &&
            (&local_118)[lVar329] == (secp256k1_gej *)0x0) {
          unaff_R14 = (secp256k1_gej *)(ulong)(iVar316 - 1);
        }
        pcStack_130 = (code *)0x123341;
        iVar316 = (int)unaff_R14;
        in_RSI = unaff_R14;
        psVar319 = unaff_R12;
        iVar311 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar316,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar311 < 1) goto LAB_001234c6;
        pcStack_130 = (code *)0x12335c;
        in_RSI = unaff_R14;
        psVar319 = unaff_R12;
        iVar311 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar316,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (0 < iVar311) goto LAB_001234cb;
        unaff_R12 = (secp256k1_gej *)local_110;
        pcStack_130 = (code *)0x123379;
        in_RSI = unaff_R14;
        psVar319 = unaff_R12;
        iVar311 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar316,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar311 < 1) goto LAB_001234d0;
        pcStack_130 = (code *)0x123394;
        in_RSI = unaff_R14;
        psVar319 = unaff_R12;
        iVar311 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar316,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (-1 < iVar311) goto LAB_001234d5;
        uVar313 = (int)local_120 + 1;
        uVar322 = (ulong)uVar313;
      } while (uVar313 != 0xc);
      pcStack_130 = (code *)0x1233bb;
      uVar313 = secp256k1_fe_sqrt((secp256k1_fe *)local_e8,(secp256k1_fe *)(local_e8 + 0x30));
      psVar318 = (secp256k1_gej *)(ulong)uVar313;
    }
LAB_001233cb:
    unaff_R14 = (secp256k1_gej *)&stack0xffffffffffffff98;
    pcStack_130 = (code *)0x1233db;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    local_68 = (local_48 >> 0x30) * 0x1000003d1 + local_68;
    uStack_60 = (local_68 >> 0x34) + uStack_60;
    local_58 = (uStack_60 >> 0x34) + local_58;
    uVar322 = (local_58 >> 0x34) + uStack_50;
    uStack_50 = uVar322 & 0xfffffffffffff;
    local_48 = (uVar322 >> 0x34) + (local_48 & 0xffffffffffff);
    local_58 = local_58 & 0xfffffffffffff;
    uStack_60 = uStack_60 & 0xfffffffffffff;
    local_68 = local_68 & 0xfffffffffffff;
    iStack_40 = 1;
    pcStack_130 = (code *)0x123465;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    psVar319 = (secp256k1_gej *)(local_e8 + 0x30);
    pcStack_130 = (code *)0x123472;
    in_RSI = unaff_R14;
    iVar311 = secp256k1_fe_sqrt((secp256k1_fe *)psVar319,(secp256k1_fe *)unaff_R14);
    if ((int)psVar318 == iVar311) {
      return (int)psVar318;
    }
  }
  pcStack_130 = secp256k1_ge_x_frac_on_curve_var;
  secp256k1_fe_is_square_var_cold_18();
  b = (secp256k1_fe *)0xfffffffffffff;
  psVar305 = (secp256k1_gej *)0x1000003d0;
  psStack_1e8 = (secp256k1_gej *)0x12351c;
  psStack_158 = psVar318;
  psStack_150 = unaff_R12;
  psStack_148 = unaff_R13;
  psStack_140 = unaff_R14;
  psStack_138 = (secp256k1_gej *)unaff_R15;
  pcStack_130 = (code *)unaff_RBP;
  secp256k1_fe_verify(&in_RSI->x);
  uVar322 = (in_RSI->x).n[4];
  uVar317 = (uVar322 >> 0x30) * 0x1000003d1 + (in_RSI->x).n[0];
  if (((uVar317 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar317 & 0xfffffffffffff) == 0)) {
    uVar312 = (uVar317 >> 0x34) + (in_RSI->x).n[1];
    psVar318 = (secp256k1_gej *)((uVar312 >> 0x34) + (in_RSI->x).n[2]);
    psVar320 = (secp256k1_gej *)(((ulong)psVar318 >> 0x34) + (in_RSI->x).n[3]);
    uVar322 = ((ulong)psVar320 >> 0x34) + (uVar322 & 0xffffffffffff);
    if ((((uVar312 | uVar317 | (ulong)psVar318 | (ulong)psVar320) & 0xfffffffffffff) != 0 ||
         uVar322 != 0) &&
       (((uVar317 | 0x1000003d0) & uVar312 & (ulong)psVar318 & (ulong)psVar320 &
        (uVar322 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_001235c2;
    psStack_1e8 = (secp256k1_gej *)0x123d98;
    secp256k1_ge_x_frac_on_curve_var_cold_1();
LAB_00123d98:
    psStack_1e8 = (secp256k1_gej *)0x123d9d;
    secp256k1_ge_x_frac_on_curve_var_cold_6();
LAB_00123d9d:
    psStack_1e8 = (secp256k1_gej *)0x123da2;
    secp256k1_ge_x_frac_on_curve_var_cold_5();
LAB_00123da2:
    psVar327 = unaff_R13;
    psVar330 = unaff_R12;
    psStack_1e8 = (secp256k1_gej *)0x123da7;
    secp256k1_ge_x_frac_on_curve_var_cold_4();
LAB_00123da7:
    psStack_1e8 = (secp256k1_gej *)0x123dac;
    secp256k1_ge_x_frac_on_curve_var_cold_3();
  }
  else {
LAB_001235c2:
    psStack_1e8 = (secp256k1_gej *)0x1235d2;
    psVar318 = in_RSI;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_1c0 + 0x30),&in_RSI->x,&psVar319->x);
    psStack_1e8 = (secp256k1_gej *)0x1235da;
    psVar320 = psVar319;
    secp256k1_fe_verify(&psVar319->x);
    if (8 < (psVar319->x).magnitude) goto LAB_00123d98;
    b = (secp256k1_fe *)auStack_1c0;
    uVar322 = (psVar319->x).n[0];
    uVar317 = (psVar319->x).n[1];
    unaff_R12 = (secp256k1_gej *)(psVar319->x).n[2];
    unaff_R13 = (secp256k1_gej *)(psVar319->x).n[3];
    uVar312 = (psVar319->x).n[4];
    psVar305 = (secp256k1_gej *)0xfffffffffffff;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar322 * 2;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = unaff_R13;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar317 * 2;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = unaff_R12;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar312;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = uVar312;
    uVar307 = SUB168(auVar3 * auVar143,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar307 & 0xfffffffffffff;
    auVar1 = auVar2 * auVar142 + auVar1 * auVar141 + auVar4 * ZEXT816(0x1000003d10);
    uVar314 = auVar1._0_8_;
    uStack_1c8 = uVar314 & 0xfffffffffffff;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = uVar314 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar312 = uVar312 * 2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar322;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar312;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar317 * 2;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = unaff_R13;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = unaff_R12;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = unaff_R12;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar307 >> 0x34 | SUB168(auVar3 * auVar143,8) << 0xc;
    auVar1 = auVar5 * auVar144 + auVar253 + auVar6 * auVar145 + auVar7 * auVar146 +
             auVar8 * ZEXT816(0x1000003d10);
    uVar307 = auVar1._0_8_;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uVar307 >> 0x34 | auVar1._8_8_ << 0xc;
    uStack_1d8 = (uVar307 & 0xfffffffffffff) >> 0x30;
    psStack_1d0 = (secp256k1_gej *)(uVar307 & 0xffffffffffff);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar322;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = uVar322;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar317;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar312;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (long)unaff_R12 * 2;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = unaff_R13;
    auVar1 = auVar10 * auVar148 + auVar254 + auVar11 * auVar149;
    uVar307 = auVar1._0_8_;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = uVar307 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = (uVar307 & 0xfffffffffffff) << 4 | uStack_1d8;
    auVar1 = auVar9 * auVar147 + ZEXT816(0x1000003d1) * auVar150;
    uVar307 = auVar1._0_8_;
    auStack_1c0._0_8_ = uVar307 & 0xfffffffffffff;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = uVar307 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar322 * 2;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar317;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = unaff_R12;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uVar312;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = unaff_R13;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = unaff_R13;
    auVar2 = auVar13 * auVar152 + auVar256 + auVar14 * auVar153;
    uVar307 = auVar2._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar307 & 0xfffffffffffff;
    auVar1 = auVar12 * auVar151 + auVar255 + auVar15 * ZEXT816(0x1000003d10);
    uVar314 = auVar1._0_8_;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = uVar307 >> 0x34 | auVar2._8_8_ << 0xc;
    auStack_1c0._8_8_ = uVar314 & 0xfffffffffffff;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = uVar314 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar322 * 2;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = unaff_R12;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar317;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar317;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = unaff_R13;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar312;
    auVar258 = auVar18 * auVar156 + auVar258;
    uVar322 = auVar258._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar16 * auVar154 + auVar257 + auVar17 * auVar155 + auVar19 * ZEXT816(0x1000003d10);
    uVar317 = auVar1._0_8_;
    auStack_1c0._16_8_ = uVar317 & 0xfffffffffffff;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = (uVar317 >> 0x34 | auVar1._8_8_ << 0xc) + uStack_1c8;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar322 >> 0x34 | auVar258._8_8_ << 0xc;
    auVar259 = auVar20 * ZEXT816(0x1000003d10) + auVar259;
    uVar322 = auVar259._0_8_;
    auStack_1c0._24_8_ = uVar322 & 0xfffffffffffff;
    auStack_1c0._32_8_ = (long)(psStack_1d0->x).n + (uVar322 >> 0x34 | auVar259._8_8_ << 0xc);
    auStack_1c0._40_8_ = 1;
    psStack_1e8 = (secp256k1_gej *)0x123824;
    secp256k1_fe_verify(b);
    psVar318 = (secp256k1_gej *)(auStack_1c0 + 0x30);
    psStack_1e8 = (secp256k1_gej *)0x123834;
    secp256k1_fe_mul((secp256k1_fe *)psVar318,(secp256k1_fe *)psVar318,b);
    psStack_1e8 = (secp256k1_gej *)0x12383c;
    psVar320 = in_RSI;
    secp256k1_fe_verify(&in_RSI->x);
    psVar319 = in_RSI;
    if (8 < (in_RSI->x).magnitude) goto LAB_00123d9d;
    uVar322 = (in_RSI->x).n[0];
    uVar317 = (in_RSI->x).n[1];
    unaff_R12 = (secp256k1_gej *)(in_RSI->x).n[2];
    unaff_R13 = (secp256k1_gej *)(in_RSI->x).n[3];
    uVar312 = (in_RSI->x).n[4];
    psVar305 = (secp256k1_gej *)0xfffffffffffff;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar322 * 2;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = unaff_R13;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar317 * 2;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = unaff_R12;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar312;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar312;
    uVar307 = SUB168(auVar23 * auVar159,0);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar307 & 0xfffffffffffff;
    auVar1 = auVar22 * auVar158 + auVar21 * auVar157 + auVar24 * ZEXT816(0x1000003d10);
    uVar314 = auVar1._0_8_;
    uStack_1c8 = uVar314 & 0xfffffffffffff;
    auVar260._8_8_ = 0;
    auVar260._0_8_ = uVar314 >> 0x34 | auVar1._8_8_ << 0xc;
    b = (secp256k1_fe *)(uVar312 * 2);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar322;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = b;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar317 * 2;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = unaff_R13;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = unaff_R12;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = unaff_R12;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar307 >> 0x34 | SUB168(auVar23 * auVar159,8) << 0xc;
    auVar1 = auVar25 * auVar160 + auVar260 + auVar26 * auVar161 + auVar27 * auVar162 +
             auVar28 * ZEXT816(0x1000003d10);
    uVar312 = auVar1._0_8_;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = uVar312 >> 0x34 | auVar1._8_8_ << 0xc;
    uStack_1d8 = (uVar312 & 0xfffffffffffff) >> 0x30;
    psVar318 = (secp256k1_gej *)(uVar312 & 0xffffffffffff);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar322;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar322;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar317;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = b;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = (long)unaff_R12 * 2;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = unaff_R13;
    auVar1 = auVar30 * auVar164 + auVar261 + auVar31 * auVar165;
    uVar312 = auVar1._0_8_;
    auVar263._8_8_ = 0;
    auVar263._0_8_ = uVar312 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = (uVar312 & 0xfffffffffffff) << 4 | uStack_1d8;
    auVar1 = auVar29 * auVar163 + ZEXT816(0x1000003d1) * auVar166;
    uVar312 = auVar1._0_8_;
    auStack_1c0._0_8_ = uVar312 & 0xfffffffffffff;
    auVar262._8_8_ = 0;
    auVar262._0_8_ = uVar312 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar322 * 2;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar317;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = unaff_R12;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = b;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = unaff_R13;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = unaff_R13;
    auVar2 = auVar33 * auVar168 + auVar263 + auVar34 * auVar169;
    uVar312 = auVar2._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar312 & 0xfffffffffffff;
    auVar1 = auVar32 * auVar167 + auVar262 + auVar35 * ZEXT816(0x1000003d10);
    uVar307 = auVar1._0_8_;
    auVar265._8_8_ = 0;
    auVar265._0_8_ = uVar312 >> 0x34 | auVar2._8_8_ << 0xc;
    auStack_1c0._8_8_ = uVar307 & 0xfffffffffffff;
    auVar264._8_8_ = 0;
    auVar264._0_8_ = uVar307 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar322 * 2;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = unaff_R12;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar317;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar317;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = unaff_R13;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = b;
    auVar265 = auVar38 * auVar172 + auVar265;
    uVar322 = auVar265._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar36 * auVar170 + auVar264 + auVar37 * auVar171 + auVar39 * ZEXT816(0x1000003d10);
    uVar317 = auVar1._0_8_;
    psVar319 = (secp256k1_gej *)(uVar322 >> 0x34 | auVar265._8_8_ << 0xc);
    auStack_1c0._16_8_ = uVar317 & 0xfffffffffffff;
    auVar266._8_8_ = 0;
    auVar266._0_8_ = (uVar317 >> 0x34 | auVar1._8_8_ << 0xc) + uStack_1c8;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = psVar319;
    auVar266 = auVar40 * ZEXT816(0x1000003d10) + auVar266;
    uVar322 = auVar266._0_8_;
    auStack_1c0._24_8_ = uVar322 & 0xfffffffffffff;
    auStack_1c0._32_8_ = (long)(psVar318->x).n + (uVar322 >> 0x34 | auVar266._8_8_ << 0xc);
    auStack_1c0._40_8_ = 1;
    psStack_1e8 = (secp256k1_gej *)0x123a83;
    psStack_1d0 = psVar318;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1c0);
    psStack_1e8 = (secp256k1_gej *)0x123a8b;
    psVar320 = (secp256k1_gej *)auStack_1c0;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1c0);
    psVar327 = (secp256k1_gej *)auStack_1c0._24_8_;
    psVar330 = (secp256k1_gej *)auStack_1c0._16_8_;
    in_RSI = (secp256k1_gej *)auStack_1c0;
    if (8 < (int)auStack_1c0._40_4_) goto LAB_00123da2;
    psVar305 = (secp256k1_gej *)0xfffffffffffff;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = auStack_1c0._0_8_ * 2;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = auStack_1c0._24_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auStack_1c0._8_8_ * 2;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = auStack_1c0._16_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = auStack_1c0._32_8_;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = auStack_1c0._32_8_;
    uVar322 = SUB168(auVar43 * auVar175,0);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar42 * auVar174 + auVar41 * auVar173 + auVar44 * ZEXT816(0x1000003d10);
    uVar317 = auVar1._0_8_;
    uStack_1c8 = uVar317 & 0xfffffffffffff;
    auVar267._8_8_ = 0;
    auVar267._0_8_ = uVar317 >> 0x34 | auVar1._8_8_ << 0xc;
    b = (secp256k1_fe *)(auStack_1c0._32_8_ * 2);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = auStack_1c0._0_8_;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = b;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = auStack_1c0._8_8_ * 2;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = auStack_1c0._24_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = auStack_1c0._16_8_;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = auStack_1c0._16_8_;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar322 >> 0x34 | SUB168(auVar43 * auVar175,8) << 0xc;
    auVar1 = auVar45 * auVar176 + auVar267 + auVar46 * auVar177 + auVar47 * auVar178 +
             auVar48 * ZEXT816(0x1000003d10);
    uVar322 = auVar1._0_8_;
    auVar268._8_8_ = 0;
    auVar268._0_8_ = uVar322 >> 0x34 | auVar1._8_8_ << 0xc;
    uStack_1d8 = (uVar322 & 0xfffffffffffff) >> 0x30;
    psVar318 = (secp256k1_gej *)(uVar322 & 0xffffffffffff);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = auStack_1c0._0_8_;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = auStack_1c0._0_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = auStack_1c0._8_8_;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = b;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = auStack_1c0._16_8_ * 2;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = auStack_1c0._24_8_;
    auVar1 = auVar50 * auVar180 + auVar268 + auVar51 * auVar181;
    uVar322 = auVar1._0_8_;
    auVar270._8_8_ = 0;
    auVar270._0_8_ = uVar322 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = (uVar322 & 0xfffffffffffff) << 4 | uStack_1d8;
    auVar1 = auVar49 * auVar179 + ZEXT816(0x1000003d1) * auVar182;
    uVar317 = auVar1._0_8_;
    auVar269._8_8_ = 0;
    auVar269._0_8_ = uVar317 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = auStack_1c0._0_8_ * 2;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = auStack_1c0._8_8_;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = auStack_1c0._16_8_;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = b;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = auStack_1c0._24_8_;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = auStack_1c0._24_8_;
    auVar2 = auVar53 * auVar184 + auVar270 + auVar54 * auVar185;
    uVar322 = auVar2._0_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar52 * auVar183 + auVar269 + auVar55 * ZEXT816(0x1000003d10);
    uVar312 = auVar1._0_8_;
    auVar272._8_8_ = 0;
    auVar272._0_8_ = uVar322 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar271._8_8_ = 0;
    auVar271._0_8_ = uVar312 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = auStack_1c0._0_8_ * 2;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = auStack_1c0._16_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = auStack_1c0._8_8_;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = auStack_1c0._8_8_;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = auStack_1c0._24_8_;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = b;
    auVar272 = auVar58 * auVar188 + auVar272;
    uVar322 = auVar272._0_8_;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar56 * auVar186 + auVar271 + auVar57 * auVar187 + auVar59 * ZEXT816(0x1000003d10);
    uVar307 = auVar1._0_8_;
    psVar319 = (secp256k1_gej *)(uVar322 >> 0x34 | auVar272._8_8_ << 0xc);
    auStack_1c0._16_8_ = uVar307 & 0xfffffffffffff;
    auVar273._8_8_ = 0;
    auVar273._0_8_ = (uVar307 >> 0x34 | auVar1._8_8_ << 0xc) + uStack_1c8;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = psVar319;
    auVar273 = auVar60 * ZEXT816(0x1000003d10) + auVar273;
    uVar322 = auVar273._0_8_;
    auStack_1c0._24_8_ = uVar322 & 0xfffffffffffff;
    auStack_1c0._32_8_ = (long)(psVar318->x).n + (uVar322 >> 0x34 | auVar273._8_8_ << 0xc);
    auStack_1c0._40_8_ = 1;
    psStack_1e8 = (secp256k1_gej *)0x123cce;
    psStack_1d0 = psVar318;
    auStack_1c0._0_8_ = uVar317 & 0xfffffffffffff;
    auStack_1c0._8_8_ = uVar312 & 0xfffffffffffff;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1c0);
    psStack_1e8 = (secp256k1_gej *)0x123cd6;
    psVar320 = (secp256k1_gej *)auStack_1c0;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1c0);
    if (0x10 < (int)auStack_1c0._40_4_) goto LAB_00123da7;
    psVar319 = (secp256k1_gej *)auStack_1c0;
    auStack_1c0._0_8_ = auStack_1c0._0_8_ * 2;
    auStack_1c0._8_8_ = auStack_1c0._8_8_ * 2;
    auStack_1c0._16_8_ = auStack_1c0._16_8_ * 2;
    auStack_1c0._24_8_ = auStack_1c0._24_8_ * 2;
    auStack_1c0._32_8_ = auStack_1c0._32_8_ << 1;
    auStack_1c0._44_4_ = 0;
    auStack_1c0._40_4_ = auStack_1c0._40_4_ * 2;
    psStack_1e8 = (secp256k1_gej *)0x123d1a;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    b = (secp256k1_fe *)(auStack_1c0 + 0x30);
    psStack_1e8 = (secp256k1_gej *)0x123d27;
    secp256k1_fe_verify(b);
    psStack_1e8 = (secp256k1_gej *)0x123d2f;
    psVar320 = psVar319;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    iStack_168 = auStack_1c0._40_4_ + iStack_168;
    if (iStack_168 < 0x21) {
      auStack_1c0._48_8_ = auStack_1c0._48_8_ + auStack_1c0._0_8_;
      uStack_188 = uStack_188 + auStack_1c0._8_8_;
      uStack_180 = (long)((secp256k1_fe *)auStack_1c0._16_8_)->n + uStack_180;
      uStack_178 = (long)((secp256k1_fe *)auStack_1c0._24_8_)->n + uStack_178;
      uStack_170 = uStack_170 + auStack_1c0._32_8_;
      iStack_164 = 0;
      psStack_1e8 = (secp256k1_gej *)0x123d79;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_1c0 + 0x30));
      psStack_1e8 = (secp256k1_gej *)0x123d81;
      iVar311 = secp256k1_fe_is_square_var((secp256k1_fe *)(auStack_1c0 + 0x30));
      return iVar311;
    }
  }
  psStack_1e8 = (secp256k1_gej *)secp256k1_gej_add_var;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psStack_4c0 = (secp256k1_gej *)0x123dd3;
  psVar324 = psVar318;
  psStack_210 = psVar319;
  psStack_208 = psVar330;
  psStack_200 = psVar327;
  psStack_1f8 = b;
  psStack_1f0 = psVar305;
  psStack_1e8 = in_RSI;
  secp256k1_gej_verify(psVar318);
  psStack_4c0 = (secp256k1_gej *)0x123ddb;
  secp256k1_gej_verify(a);
  psVar319 = a;
  if ((psVar318->infinity != 0) || (psVar319 = psVar318, a->infinity != 0)) {
    pvVar308 = memcpy(psVar320,psVar319,0x98);
    return (int)pvVar308;
  }
  psVar319 = (secp256k1_gej *)&a->z;
  psStack_4c0 = (secp256k1_gej *)0x123e32;
  psVar306 = psVar319;
  psStack_4b0 = psVar320;
  psStack_4a8 = psVar318;
  secp256k1_fe_verify((secp256k1_fe *)psVar319);
  if ((a->z).magnitude < 9) {
    uVar322 = ((secp256k1_fe *)psVar319)->n[0];
    uVar317 = (a->z).n[1];
    psVar330 = (secp256k1_gej *)(a->z).n[2];
    psVar327 = (secp256k1_gej *)(a->z).n[3];
    uVar312 = (a->z).n[4];
    psVar305 = (secp256k1_gej *)0xfffffffffffff;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar322 * 2;
    auVar189._8_8_ = 0;
    auVar189._0_8_ = psVar327;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar317 * 2;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = psVar330;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar312;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar312;
    uVar307 = SUB168(auVar63 * auVar191,0);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar307 & 0xfffffffffffff;
    auVar1 = auVar62 * auVar190 + auVar61 * auVar189 + auVar64 * ZEXT816(0x1000003d10);
    uVar314 = auVar1._0_8_;
    auStack_2a8._56_8_ = uVar314 & 0xfffffffffffff;
    auVar274._8_8_ = 0;
    auVar274._0_8_ = uVar314 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar312 = uVar312 * 2;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar322;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar312;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar317 * 2;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = psVar327;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = psVar330;
    auVar194._8_8_ = 0;
    auVar194._0_8_ = psVar330;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar307 >> 0x34 | SUB168(auVar63 * auVar191,8) << 0xc;
    auVar1 = auVar65 * auVar192 + auVar274 + auVar66 * auVar193 + auVar67 * auVar194 +
             auVar68 * ZEXT816(0x1000003d10);
    uVar307 = auVar1._0_8_;
    auVar275._8_8_ = 0;
    auVar275._0_8_ = uVar307 >> 0x34 | auVar1._8_8_ << 0xc;
    auStack_3d8._0_8_ = (uVar307 & 0xfffffffffffff) >> 0x30;
    psVar324 = (secp256k1_gej *)(uVar307 & 0xffffffffffff);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar322;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = uVar322;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar317;
    auVar196._8_8_ = 0;
    auVar196._0_8_ = uVar312;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = (long)psVar330 * 2;
    auVar197._8_8_ = 0;
    auVar197._0_8_ = psVar327;
    auVar1 = auVar70 * auVar196 + auVar275 + auVar71 * auVar197;
    uVar307 = auVar1._0_8_;
    auVar277._8_8_ = 0;
    auVar277._0_8_ = uVar307 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = (uVar307 & 0xfffffffffffff) << 4 | auStack_3d8._0_8_;
    auVar1 = auVar69 * auVar195 + ZEXT816(0x1000003d1) * auVar198;
    uVar307 = auVar1._0_8_;
    sStack_240.n[0] = uVar307 & 0xfffffffffffff;
    auVar276._8_8_ = 0;
    auVar276._0_8_ = uVar307 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar322 * 2;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = uVar317;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = psVar330;
    auVar200._8_8_ = 0;
    auVar200._0_8_ = uVar312;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = psVar327;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = psVar327;
    auVar2 = auVar73 * auVar200 + auVar277 + auVar74 * auVar201;
    uVar307 = auVar2._0_8_;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar307 & 0xfffffffffffff;
    auVar1 = auVar72 * auVar199 + auVar276 + auVar75 * ZEXT816(0x1000003d10);
    uVar314 = auVar1._0_8_;
    auVar279._8_8_ = 0;
    auVar279._0_8_ = uVar307 >> 0x34 | auVar2._8_8_ << 0xc;
    sStack_240.n[1] = uVar314 & 0xfffffffffffff;
    auVar278._8_8_ = 0;
    auVar278._0_8_ = uVar314 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar322 * 2;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = psVar330;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar317;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = uVar317;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = psVar327;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar312;
    auVar279 = auVar78 * auVar204 + auVar279;
    uVar322 = auVar279._0_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar76 * auVar202 + auVar278 + auVar77 * auVar203 + auVar79 * ZEXT816(0x1000003d10);
    uVar317 = auVar1._0_8_;
    sStack_240.n[2] = uVar317 & 0xfffffffffffff;
    auVar280._8_8_ = 0;
    auVar280._0_8_ = (uVar317 >> 0x34 | auVar1._8_8_ << 0xc) + auStack_2a8._56_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar322 >> 0x34 | auVar279._8_8_ << 0xc;
    auVar280 = auVar80 * ZEXT816(0x1000003d10) + auVar280;
    uVar322 = auVar280._0_8_;
    sStack_240.n[3] = uVar322 & 0xfffffffffffff;
    sStack_240.n[4] = (long)(psVar324->x).n + (uVar322 >> 0x34 | auVar280._8_8_ << 0xc);
    sStack_240.magnitude = 1;
    sStack_240.normalized = 0;
    psStack_4c0 = (secp256k1_gej *)0x124093;
    psStack_490 = (secp256k1_fe *)psVar319;
    auStack_3d8._48_8_ = psVar324;
    secp256k1_fe_verify(&sStack_240);
    psVar318 = psStack_4a8;
    psVar319 = (secp256k1_gej *)&psStack_4a8->z;
    psStack_4c0 = (secp256k1_gej *)0x1240a4;
    psVar306 = psVar319;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    if (8 < (psVar318->z).magnitude) goto LAB_00124f4e;
    psVar330 = (secp256k1_gej *)(auStack_2a8 + 0x38);
    uVar322 = ((secp256k1_fe *)psVar319)->n[0];
    uVar317 = (psVar318->z).n[1];
    uVar312 = (psVar318->z).n[2];
    psVar327 = (secp256k1_gej *)(psVar318->z).n[3];
    uVar307 = (psVar318->z).n[4];
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar322 * 2;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = psVar327;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar317 * 2;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = uVar312;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar307;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = uVar307;
    uVar314 = SUB168(auVar83 * auVar207,0);
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar314 & 0xfffffffffffff;
    auVar1 = auVar82 * auVar206 + auVar81 * auVar205 + auVar84 * ZEXT816(0x1000003d10);
    uVar315 = auVar1._0_8_;
    auStack_3d8._48_8_ = uVar315 & 0xfffffffffffff;
    auVar281._8_8_ = 0;
    auVar281._0_8_ = uVar315 >> 0x34 | auVar1._8_8_ << 0xc;
    uVar307 = uVar307 * 2;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar322;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = uVar307;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar317 * 2;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = psVar327;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar312;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uVar312;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar314 >> 0x34 | SUB168(auVar83 * auVar207,8) << 0xc;
    auVar1 = auVar85 * auVar208 + auVar281 + auVar86 * auVar209 + auVar87 * auVar210 +
             auVar88 * ZEXT816(0x1000003d10);
    auStack_3d8._0_8_ = auVar1._0_8_;
    auVar282._8_8_ = 0;
    auVar282._0_8_ = (ulong)auStack_3d8._0_8_ >> 0x34 | auVar1._8_8_ << 0xc;
    auStack_438._48_8_ = (auStack_3d8._0_8_ & 0xfffffffffffff) >> 0x30;
    auStack_3d8._0_8_ = auStack_3d8._0_8_ & 0xffffffffffff;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar322;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = uVar322;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar317;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = uVar307;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar312 * 2;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = psVar327;
    auVar1 = auVar90 * auVar212 + auVar282 + auVar91 * auVar213;
    uVar314 = auVar1._0_8_;
    auVar284._8_8_ = 0;
    auVar284._0_8_ = uVar314 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = (uVar314 & 0xfffffffffffff) << 4 | auStack_438._48_8_;
    auVar1 = auVar89 * auVar211 + ZEXT816(0x1000003d1) * auVar214;
    uVar314 = auVar1._0_8_;
    auStack_2a8._56_8_ = uVar314 & 0xfffffffffffff;
    auVar283._8_8_ = 0;
    auVar283._0_8_ = uVar314 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar322 * 2;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = uVar317;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar312;
    auVar216._8_8_ = 0;
    auVar216._0_8_ = uVar307;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = psVar327;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = psVar327;
    auVar2 = auVar93 * auVar216 + auVar284 + auVar94 * auVar217;
    uVar314 = auVar2._0_8_;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar314 & 0xfffffffffffff;
    auVar1 = auVar92 * auVar215 + auVar283 + auVar95 * ZEXT816(0x1000003d10);
    uVar315 = auVar1._0_8_;
    auVar286._8_8_ = 0;
    auVar286._0_8_ = uVar314 >> 0x34 | auVar2._8_8_ << 0xc;
    uStack_268 = uVar315 & 0xfffffffffffff;
    auVar285._8_8_ = 0;
    auVar285._0_8_ = uVar315 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar322 * 2;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = uVar312;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar317;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = uVar317;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = psVar327;
    auVar220._8_8_ = 0;
    auVar220._0_8_ = uVar307;
    auVar286 = auVar98 * auVar220 + auVar286;
    uVar322 = auVar286._0_8_;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar96 * auVar218 + auVar285 + auVar97 * auVar219 + auVar99 * ZEXT816(0x1000003d10);
    uVar317 = auVar1._0_8_;
    uStack_260 = uVar317 & 0xfffffffffffff;
    auVar287._8_8_ = 0;
    auVar287._0_8_ =
         (long)(((secp256k1_gej *)auStack_3d8._48_8_)->x).n +
         (uVar317 >> 0x34 | auVar1._8_8_ << 0xc);
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar322 >> 0x34 | auVar286._8_8_ << 0xc;
    auVar287 = auVar100 * ZEXT816(0x1000003d10) + auVar287;
    uVar322 = auVar287._0_8_;
    uStack_258 = uVar322 & 0xfffffffffffff;
    lStack_250 = (uVar322 >> 0x34 | auVar287._8_8_ << 0xc) + auStack_3d8._0_8_;
    uStack_248 = 1;
    psStack_4c0 = (secp256k1_gej *)0x124309;
    psStack_498 = psVar319;
    secp256k1_fe_verify((secp256k1_fe *)psVar330);
    psVar318 = psStack_4a8;
    psVar319 = (secp256k1_gej *)(auStack_3d8 + 0x30);
    psStack_4c0 = (secp256k1_gej *)0x12432c;
    secp256k1_fe_mul((secp256k1_fe *)psVar319,&psStack_4a8->x,&sStack_240);
    psStack_4c0 = (secp256k1_gej *)0x12433f;
    secp256k1_fe_mul((secp256k1_fe *)auStack_3d8,&a->x,(secp256k1_fe *)psVar330);
    psVar305 = (secp256k1_gej *)(auStack_438 + 0x30);
    psStack_4c0 = (secp256k1_gej *)0x124356;
    secp256k1_fe_mul((secp256k1_fe *)psVar305,&psVar318->y,&sStack_240);
    psStack_4c0 = (secp256k1_gej *)0x124366;
    secp256k1_fe_mul((secp256k1_fe *)psVar305,(secp256k1_fe *)psVar305,psStack_490);
    psVar318 = (secp256k1_gej *)auStack_378;
    psStack_4c0 = (secp256k1_gej *)0x124380;
    secp256k1_fe_mul((secp256k1_fe *)psVar318,&a->y,(secp256k1_fe *)psVar330);
    psStack_4c0 = (secp256k1_gej *)0x124390;
    psVar324 = psVar318;
    secp256k1_fe_mul((secp256k1_fe *)psVar318,(secp256k1_fe *)psVar318,&psStack_498->x);
    psStack_4c0 = (secp256k1_gej *)0x124398;
    psVar306 = psVar319;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    if (1 < iStack_380) goto LAB_00124f53;
    psVar305 = (secp256k1_gej *)(0x3ffffbfffff0bc - auStack_3d8._48_8_);
    psVar330 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_3a0);
    psVar327 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_398);
    psVar318 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_390);
    uStack_2b0 = 2;
    psStack_4c0 = (secp256k1_gej *)0x124419;
    auStack_308._48_8_ = psVar305;
    psStack_2d0 = psVar330;
    psStack_2c8 = psVar327;
    psStack_2c0 = psVar318;
    uStack_2b8 = 0x3fffffffffffc - uStack_388;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_308 + 0x30));
    psStack_4c0 = (secp256k1_gej *)0x124421;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_308 + 0x30));
    psVar319 = (secp256k1_gej *)auStack_3d8;
    psStack_4c0 = (secp256k1_gej *)0x124431;
    psVar306 = psVar319;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    if (0x1e < (int)auStack_3d8._40_4_) goto LAB_00124f58;
    psVar305 = (secp256k1_gej *)((long)(psVar305->x).n + auStack_3d8._0_8_);
    psVar330 = (secp256k1_gej *)((long)(psVar330->x).n + auStack_3d8._8_8_);
    psVar327 = (secp256k1_gej *)((long)(psVar327->x).n + auStack_3d8._16_8_);
    psVar318 = (secp256k1_gej *)((long)(psVar318->x).n + auStack_3d8._24_8_);
    uStack_4a0 = (0x3fffffffffffc - uStack_388) + auStack_3d8._32_8_;
    uStack_2b0 = (ulong)(auStack_3d8._40_4_ + 2);
    psStack_4c0 = (secp256k1_gej *)0x1244ab;
    psStack_468 = psVar327;
    psStack_460 = psVar318;
    psStack_458 = psVar305;
    psStack_450 = psVar330;
    auStack_308._48_8_ = psVar305;
    psStack_2d0 = psVar330;
    psStack_2c8 = psVar327;
    psStack_2c0 = psVar318;
    uStack_2b8 = uStack_4a0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_308 + 0x30));
    psVar319 = (secp256k1_gej *)auStack_378;
    psStack_4c0 = (secp256k1_gej *)0x1244bb;
    psVar306 = psVar319;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    if (1 < (int)auStack_378._40_4_) goto LAB_00124f5d;
    psVar318 = (secp256k1_gej *)(0x3ffffbfffff0bc - auStack_378._0_8_);
    psVar305 = (secp256k1_gej *)(0x3ffffffffffffc - auStack_378._8_8_);
    psVar330 = (secp256k1_gej *)(0x3ffffffffffffc - auStack_378._16_8_);
    psVar327 = (secp256k1_gej *)(0x3fffffffffffc - auStack_378._32_8_);
    auStack_308._40_8_ = 2;
    psStack_4c0 = (secp256k1_gej *)0x12453c;
    auStack_308._0_8_ = psVar318;
    auStack_308._8_8_ = psVar305;
    auStack_308._16_8_ = psVar330;
    auStack_308._24_8_ = (secp256k1_gej *)(0x3ffffffffffffc - auStack_378._24_8_);
    auStack_308._32_8_ = psVar327;
    secp256k1_fe_verify((secp256k1_fe *)auStack_308);
    psStack_4c0 = (secp256k1_gej *)0x124544;
    secp256k1_fe_verify((secp256k1_fe *)auStack_308);
    psVar319 = (secp256k1_gej *)(auStack_438 + 0x30);
    psStack_4c0 = (secp256k1_gej *)0x124554;
    psVar306 = psVar319;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    if (0x1e < (int)uStack_3e0) goto LAB_00124f62;
    psStack_478 = (secp256k1_gej *)((long)(psVar318->x).n + auStack_438._48_8_);
    psStack_480 = (secp256k1_gej *)((long)(psVar305->x).n + uStack_400);
    psVar330 = (secp256k1_gej *)((long)(psVar330->x).n + uStack_3f8);
    psVar318 = (secp256k1_gej *)
               ((long)(((secp256k1_gej *)(0x3ffffffffffffc - auStack_378._24_8_))->x).n + uStack_3f0
               );
    psVar327 = (secp256k1_gej *)((long)(psVar327->x).n + uStack_3e8);
    auStack_308._44_4_ = 0;
    auStack_308._40_4_ = uStack_3e0 + 2;
    psStack_4c0 = (secp256k1_gej *)0x1245d3;
    psStack_488 = psVar330;
    uStack_470 = (ulong)uStack_3e0;
    auStack_308._0_8_ = psStack_478;
    auStack_308._8_8_ = psStack_480;
    auStack_308._16_8_ = psVar330;
    auStack_308._24_8_ = psVar318;
    auStack_308._32_8_ = psVar327;
    secp256k1_fe_verify((secp256k1_fe *)auStack_308);
    psStack_4c0 = (secp256k1_gej *)0x1245e0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_308 + 0x30));
    psVar305 = psStack_4b0;
    uVar322 = (uStack_4a0 >> 0x30) * 0x1000003d1 + (long)psStack_458;
    if (((uVar322 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar322 & 0xfffffffffffff) == 0)) {
      uVar314 = (long)(psStack_450->x).n + (uVar322 >> 0x34);
      uVar317 = (long)(psStack_468->x).n + (uVar314 >> 0x34);
      uVar312 = (long)(psStack_460->x).n + (uVar317 >> 0x34);
      uVar307 = (uVar312 >> 0x34) + (uStack_4a0 & 0xffffffffffff);
      if ((((uVar314 | uVar322 | uVar317 | uVar312) & 0xfffffffffffff) == 0 && uVar307 == 0) ||
         (((uVar322 | 0x1000003d0) & uVar314 & uVar317 & uVar312 & (uVar307 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_4c0 = (secp256k1_gej *)0x124e86;
        secp256k1_fe_verify((secp256k1_fe *)auStack_308);
        uVar322 = ((ulong)psVar327 >> 0x30) * 0x1000003d1 + (long)psStack_478;
        if (((uVar322 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar322 & 0xfffffffffffff) == 0))
        {
          uVar314 = (long)(psStack_480->x).n + (uVar322 >> 0x34);
          uVar317 = (long)(psStack_488->x).n + (uVar314 >> 0x34);
          uVar312 = (long)(psVar318->x).n + (uVar317 >> 0x34);
          uVar307 = (uVar312 >> 0x34) + ((ulong)psVar327 & 0xffffffffffff);
          if ((((uVar314 | uVar322 | uVar317 | uVar312) & 0xfffffffffffff) == 0 && uVar307 == 0) ||
             (((uVar322 | 0x1000003d0) & uVar314 & uVar317 & uVar312 & (uVar307 ^ 0xf000000000000))
              == 0xfffffffffffff)) {
            psStack_4c0 = (secp256k1_gej *)0x124f37;
            secp256k1_gej_double_var(psStack_4b0,psStack_4a8,(secp256k1_fe *)0x0);
            return extraout_EAX_01;
          }
        }
        psStack_4c0 = (secp256k1_gej *)0x124f24;
        secp256k1_gej_set_infinity(psStack_4b0);
        return extraout_EAX_00;
      }
    }
    psStack_4b0->infinity = 0;
    psVar318 = (secp256k1_gej *)(auStack_378 + 0x30);
    psVar319 = (secp256k1_gej *)(auStack_308 + 0x30);
    psStack_4c0 = (secp256k1_gej *)0x1246cf;
    secp256k1_fe_mul((secp256k1_fe *)psVar318,(secp256k1_fe *)psVar319,psStack_490);
    psStack_4c0 = (secp256k1_gej *)0x1246e0;
    psVar324 = psStack_498;
    secp256k1_fe_mul(&psVar305->z,&psStack_498->x,(secp256k1_fe *)psVar318);
    psStack_4c0 = (secp256k1_gej *)0x1246e8;
    psVar306 = psVar319;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    psVar326 = psStack_2c0;
    psVar320 = psStack_2c8;
    if (8 < (int)uStack_2b0) goto LAB_00124f67;
    psVar306 = (secp256k1_gej *)auStack_2a8;
    psVar305 = (secp256k1_gej *)0xfffffffffffff;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = auStack_308._48_8_ * 2;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = psStack_2c0;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = (long)psStack_2d0 * 2;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = psStack_2c8;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uStack_2b8;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = uStack_2b8;
    uVar322 = SUB168(auVar103 * auVar223,0);
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar102 * auVar222 + auVar101 * auVar221 + auVar104 * ZEXT816(0x1000003d10);
    uVar317 = auVar1._0_8_;
    auStack_438._0_8_ = uVar317 & 0xfffffffffffff;
    auVar288._8_8_ = 0;
    auVar288._0_8_ = uVar317 >> 0x34 | auVar1._8_8_ << 0xc;
    psVar318 = (secp256k1_gej *)(uStack_2b8 * 2);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = auStack_308._48_8_;
    auVar224._8_8_ = 0;
    auVar224._0_8_ = psVar318;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = (long)psStack_2d0 * 2;
    auVar225._8_8_ = 0;
    auVar225._0_8_ = psStack_2c0;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = psStack_2c8;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = psStack_2c8;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar322 >> 0x34 | SUB168(auVar103 * auVar223,8) << 0xc;
    auVar1 = auVar105 * auVar224 + auVar288 + auVar106 * auVar225 + auVar107 * auVar226 +
             auVar108 * ZEXT816(0x1000003d10);
    uVar322 = auVar1._0_8_;
    auVar289._8_8_ = 0;
    auVar289._0_8_ = uVar322 >> 0x34 | auVar1._8_8_ << 0xc;
    psStack_448 = (secp256k1_gej *)((uVar322 & 0xfffffffffffff) >> 0x30);
    psVar324 = (secp256k1_gej *)(uVar322 & 0xffffffffffff);
    auVar109._8_8_ = 0;
    auVar109._0_8_ = auStack_308._48_8_;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = auStack_308._48_8_;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = psStack_2d0;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = psVar318;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = (long)psStack_2c8 * 2;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = psStack_2c0;
    auVar1 = auVar110 * auVar228 + auVar289 + auVar111 * auVar229;
    uVar322 = auVar1._0_8_;
    auVar291._8_8_ = 0;
    auVar291._0_8_ = uVar322 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = (uVar322 & 0xfffffffffffff) << 4 | (ulong)psStack_448;
    auVar1 = auVar109 * auVar227 + ZEXT816(0x1000003d1) * auVar230;
    uVar322 = auVar1._0_8_;
    auStack_2a8._0_8_ = uVar322 & 0xfffffffffffff;
    auVar290._8_8_ = 0;
    auVar290._0_8_ = uVar322 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = auStack_308._48_8_ * 2;
    auVar231._8_8_ = 0;
    auVar231._0_8_ = psStack_2d0;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = psStack_2c8;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = psVar318;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = psStack_2c0;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = psStack_2c0;
    auVar2 = auVar113 * auVar232 + auVar291 + auVar114 * auVar233;
    uVar322 = auVar2._0_8_;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar112 * auVar231 + auVar290 + auVar115 * ZEXT816(0x1000003d10);
    uVar317 = auVar1._0_8_;
    auVar293._8_8_ = 0;
    auVar293._0_8_ = uVar322 >> 0x34 | auVar2._8_8_ << 0xc;
    auStack_2a8._8_8_ = uVar317 & 0xfffffffffffff;
    auVar292._8_8_ = 0;
    auVar292._0_8_ = uVar317 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = auStack_308._48_8_ * 2;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = psStack_2c8;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = psStack_2d0;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = psStack_2d0;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = psStack_2c0;
    auVar236._8_8_ = 0;
    auVar236._0_8_ = psVar318;
    auVar293 = auVar118 * auVar236 + auVar293;
    uVar322 = auVar293._0_8_;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar116 * auVar234 + auVar292 + auVar117 * auVar235 + auVar119 * ZEXT816(0x1000003d10)
    ;
    uVar317 = auVar1._0_8_;
    psVar319 = (secp256k1_gej *)(uVar322 >> 0x34 | auVar293._8_8_ << 0xc);
    auStack_2a8._16_8_ = uVar317 & 0xfffffffffffff;
    auVar294._8_8_ = 0;
    auVar294._0_8_ = (uVar317 >> 0x34 | auVar1._8_8_ << 0xc) + auStack_438._0_8_;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = psVar319;
    auVar294 = auVar120 * ZEXT816(0x1000003d10) + auVar294;
    uVar322 = auVar294._0_8_;
    auStack_2a8._24_8_ = uVar322 & 0xfffffffffffff;
    auStack_2a8._32_8_ = (long)(psVar324->x).n + (uVar322 >> 0x34 | auVar294._8_8_ << 0xc);
    auStack_2a8._40_4_ = 1;
    auStack_2a8._44_4_ = 0;
    psStack_4c0 = (secp256k1_gej *)0x124938;
    psStack_440 = psVar324;
    secp256k1_fe_verify((secp256k1_fe *)psVar306);
    psStack_4c0 = (secp256k1_gej *)0x124940;
    secp256k1_fe_verify((secp256k1_fe *)psVar306);
    if (1 < (int)auStack_2a8._40_4_) goto LAB_00124f6c;
    auStack_2a8._0_8_ = 0x3ffffbfffff0bc - auStack_2a8._0_8_;
    auStack_2a8._8_8_ = 0x3ffffffffffffc - auStack_2a8._8_8_;
    auStack_2a8._16_8_ = 0x3ffffffffffffc - auStack_2a8._16_8_;
    auStack_2a8._24_8_ = 0x3ffffffffffffc - auStack_2a8._24_8_;
    auStack_2a8._32_8_ = 0x3fffffffffffc - auStack_2a8._32_8_;
    auStack_2a8._40_4_ = 2;
    auStack_2a8._44_4_ = 0;
    psStack_4c0 = (secp256k1_gej *)0x124996;
    secp256k1_fe_verify((secp256k1_fe *)auStack_2a8);
    psStack_4c0 = (secp256k1_gej *)0x1249ae;
    secp256k1_fe_mul((secp256k1_fe *)auStack_438,(secp256k1_fe *)auStack_2a8,
                     (secp256k1_fe *)(auStack_308 + 0x30));
    psVar324 = (secp256k1_gej *)(auStack_3d8 + 0x30);
    psStack_4c0 = (secp256k1_gej *)0x1249c6;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_378 + 0x30),(secp256k1_fe *)psVar324,
                     (secp256k1_fe *)auStack_2a8);
    psVar319 = (secp256k1_gej *)auStack_308;
    psStack_4c0 = (secp256k1_gej *)0x1249d6;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    psVar328 = (secp256k1_gej *)auStack_308._24_8_;
    psVar327 = (secp256k1_gej *)auStack_308._16_8_;
    psVar330 = psStack_4b0;
    psVar306 = psStack_4b0;
    if (6 < (int)uStack_470) goto LAB_00124f71;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = auStack_308._0_8_ * 2;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = auStack_308._24_8_;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = auStack_308._8_8_ * 2;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = auStack_308._16_8_;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = auStack_308._32_8_;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = auStack_308._32_8_;
    uVar322 = SUB168(auVar123 * auVar239,0);
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar122 * auVar238 + auVar121 * auVar237 + auVar124 * ZEXT816(0x1000003d10);
    uVar317 = auVar1._0_8_;
    psStack_440 = (secp256k1_gej *)(uVar317 & 0xfffffffffffff);
    auVar295._8_8_ = 0;
    auVar295._0_8_ = uVar317 >> 0x34 | auVar1._8_8_ << 0xc;
    psVar318 = (secp256k1_gej *)(auStack_308._32_8_ * 2);
    auVar125._8_8_ = 0;
    auVar125._0_8_ = auStack_308._0_8_;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = psVar318;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = auStack_308._8_8_ * 2;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = auStack_308._24_8_;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = auStack_308._16_8_;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = auStack_308._16_8_;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uVar322 >> 0x34 | SUB168(auVar123 * auVar239,8) << 0xc;
    auVar1 = auVar125 * auVar240 + auVar295 + auVar126 * auVar241 + auVar127 * auVar242 +
             auVar128 * ZEXT816(0x1000003d10);
    uVar322 = auVar1._0_8_;
    auVar296._8_8_ = 0;
    auVar296._0_8_ = uVar322 >> 0x34 | auVar1._8_8_ << 0xc;
    uStack_310 = (uVar322 & 0xfffffffffffff) >> 0x30;
    psVar324 = (secp256k1_gej *)(uVar322 & 0xffffffffffff);
    auVar129._8_8_ = 0;
    auVar129._0_8_ = auStack_308._0_8_;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = auStack_308._0_8_;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = auStack_308._8_8_;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = psVar318;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = auStack_308._16_8_ * 2;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = auStack_308._24_8_;
    auVar1 = auVar130 * auVar244 + auVar296 + auVar131 * auVar245;
    uVar322 = auVar1._0_8_;
    auVar298._8_8_ = 0;
    auVar298._0_8_ = uVar322 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = (uVar322 & 0xfffffffffffff) << 4 | uStack_310;
    auVar1 = auVar129 * auVar243 + ZEXT816(0x1000003d1) * auVar246;
    uVar322 = auVar1._0_8_;
    (psStack_4b0->x).n[0] = uVar322 & 0xfffffffffffff;
    auVar297._8_8_ = 0;
    auVar297._0_8_ = uVar322 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = auStack_308._0_8_ * 2;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = auStack_308._8_8_;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = auStack_308._16_8_;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = psVar318;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = auStack_308._24_8_;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = auStack_308._24_8_;
    auVar2 = auVar133 * auVar248 + auVar298 + auVar134 * auVar249;
    uVar322 = auVar2._0_8_;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar132 * auVar247 + auVar297 + auVar135 * ZEXT816(0x1000003d10);
    uVar317 = auVar1._0_8_;
    auVar300._8_8_ = 0;
    auVar300._0_8_ = uVar322 >> 0x34 | auVar2._8_8_ << 0xc;
    (psStack_4b0->x).n[1] = uVar317 & 0xfffffffffffff;
    auVar299._8_8_ = 0;
    auVar299._0_8_ = uVar317 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auStack_308._0_8_ * 2;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = auStack_308._16_8_;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = auStack_308._8_8_;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = auStack_308._8_8_;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = auStack_308._24_8_;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = psVar318;
    auVar300 = auVar138 * auVar252 + auVar300;
    uVar322 = auVar300._0_8_;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = uVar322 & 0xfffffffffffff;
    auVar1 = auVar136 * auVar250 + auVar299 + auVar137 * auVar251 + auVar139 * ZEXT816(0x1000003d10)
    ;
    uVar317 = auVar1._0_8_;
    (psStack_4b0->x).n[2] = uVar317 & 0xfffffffffffff;
    auVar301._8_8_ = 0;
    auVar301._0_8_ = (long)(psStack_440->x).n + (uVar317 >> 0x34 | auVar1._8_8_ << 0xc);
    auVar140._8_8_ = 0;
    auVar140._0_8_ = uVar322 >> 0x34 | auVar300._8_8_ << 0xc;
    auVar301 = auVar140 * ZEXT816(0x1000003d10) + auVar301;
    uVar322 = auVar301._0_8_;
    (psStack_4b0->x).n[3] = uVar322 & 0xfffffffffffff;
    (psStack_4b0->x).n[4] = (long)(psVar324->x).n + (uVar322 >> 0x34 | auVar301._8_8_ << 0xc);
    (psStack_4b0->x).magnitude = 1;
    (psStack_4b0->x).normalized = 0;
    psStack_4c0 = (secp256k1_gej *)0x124c29;
    psStack_448 = psVar324;
    secp256k1_fe_verify(&psStack_4b0->x);
    psStack_4c0 = (secp256k1_gej *)0x124c31;
    secp256k1_fe_verify(&psVar330->x);
    psVar319 = (secp256k1_gej *)auStack_438;
    psStack_4c0 = (secp256k1_gej *)0x124c41;
    psVar306 = psVar319;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    iVar311 = auStack_438._40_4_ + (psVar330->x).magnitude;
    if (0x20 < iVar311) goto LAB_00124f76;
    uVar302 = (psVar330->x).n[1];
    uVar303 = (psVar330->x).n[2];
    uVar304 = (psVar330->x).n[3];
    (psVar330->x).n[0] = (psVar330->x).n[0] + auStack_438._0_8_;
    (psVar330->x).n[1] = uVar302 + auStack_438._8_8_;
    (psVar330->x).n[2] = uVar303 + auStack_438._16_8_;
    (psVar330->x).n[3] = uVar304 + auStack_438._24_8_;
    puVar323 = (psVar330->x).n + 4;
    *puVar323 = *puVar323 + auStack_438._32_8_;
    (psVar330->x).magnitude = iVar311;
    (psVar330->x).normalized = 0;
    psStack_4c0 = (secp256k1_gej *)0x124c99;
    secp256k1_fe_verify(&psVar330->x);
    psStack_4c0 = (secp256k1_gej *)0x124ca1;
    secp256k1_fe_verify(&psVar330->x);
    psVar319 = (secp256k1_gej *)(auStack_378 + 0x30);
    psStack_4c0 = (secp256k1_gej *)0x124cb1;
    psVar306 = psVar319;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    iVar311 = iStack_320 + (psVar330->x).magnitude;
    if (0x20 < iVar311) goto LAB_00124f7b;
    uVar302 = (psVar330->x).n[1];
    uVar303 = (psVar330->x).n[2];
    uVar304 = (psVar330->x).n[3];
    psVar319 = (secp256k1_gej *)(auStack_378 + 0x30);
    (psVar330->x).n[0] = (psVar330->x).n[0] + auStack_378._48_8_;
    (psVar330->x).n[1] = uVar302 + uStack_340;
    (psVar330->x).n[2] = uVar303 + uStack_338;
    (psVar330->x).n[3] = uVar304 + uStack_330;
    puVar323 = (psVar330->x).n + 4;
    *puVar323 = *puVar323 + uStack_328;
    (psVar330->x).magnitude = iVar311;
    (psVar330->x).normalized = 0;
    psStack_4c0 = (secp256k1_gej *)0x124d04;
    secp256k1_fe_verify(&psVar330->x);
    psStack_4c0 = (secp256k1_gej *)0x124d0c;
    secp256k1_fe_verify(&psVar330->x);
    psStack_4c0 = (secp256k1_gej *)0x124d14;
    psVar306 = psVar319;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    iVar311 = iStack_320 + (psVar330->x).magnitude;
    if (0x20 < iVar311) goto LAB_00124f80;
    uVar302 = (psVar330->x).n[1];
    uVar303 = (psVar330->x).n[2];
    uVar304 = (psVar330->x).n[3];
    psVar319 = (secp256k1_gej *)(auStack_378 + 0x30);
    (psVar330->x).n[0] = (psVar330->x).n[0] + auStack_378._48_8_;
    (psVar330->x).n[1] = uVar302 + uStack_340;
    (psVar330->x).n[2] = uVar303 + uStack_338;
    (psVar330->x).n[3] = uVar304 + uStack_330;
    puVar323 = (psVar330->x).n + 4;
    *puVar323 = *puVar323 + uStack_328;
    (psVar330->x).magnitude = iVar311;
    (psVar330->x).normalized = 0;
    psStack_4c0 = (secp256k1_gej *)0x124d67;
    secp256k1_fe_verify(&psVar330->x);
    psStack_4c0 = (secp256k1_gej *)0x124d6f;
    secp256k1_fe_verify((secp256k1_fe *)psVar319);
    psStack_4c0 = (secp256k1_gej *)0x124d77;
    psVar306 = psVar330;
    secp256k1_fe_verify(&psVar330->x);
    iVar311 = (psVar330->x).magnitude + iStack_320;
    if (iVar311 < 0x21) {
      auStack_378._48_8_ = (psVar330->x).n[0] + auStack_378._48_8_;
      uStack_340 = (psVar330->x).n[1] + uStack_340;
      uStack_338 = (psVar330->x).n[2] + uStack_338;
      uStack_330 = (psVar330->x).n[3] + uStack_330;
      uStack_328 = uStack_328 + (psVar330->x).n[4];
      iStack_31c = 0;
      psStack_4c0 = (secp256k1_gej *)0x124dcc;
      iStack_320 = iVar311;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_378 + 0x30));
      psVar319 = (secp256k1_gej *)&psVar330->y;
      psStack_4c0 = (secp256k1_gej *)0x124de3;
      secp256k1_fe_mul((secp256k1_fe *)psVar319,(secp256k1_fe *)(auStack_378 + 0x30),
                       (secp256k1_fe *)auStack_308);
      psVar318 = (secp256k1_gej *)auStack_438;
      psStack_4c0 = (secp256k1_gej *)0x124dfe;
      psVar324 = psVar318;
      secp256k1_fe_mul((secp256k1_fe *)psVar318,(secp256k1_fe *)psVar318,
                       (secp256k1_fe *)(auStack_438 + 0x30));
      psStack_4c0 = (secp256k1_gej *)0x124e06;
      secp256k1_fe_verify((secp256k1_fe *)psVar319);
      psStack_4c0 = (secp256k1_gej *)0x124e0e;
      psVar306 = psVar318;
      secp256k1_fe_verify((secp256k1_fe *)psVar318);
      iVar311 = auStack_438._40_4_ + (psVar330->y).magnitude;
      if (iVar311 < 0x21) {
        uVar302 = (psVar330->y).n[1];
        uVar303 = (psVar330->y).n[2];
        uVar304 = (psVar330->y).n[3];
        (psVar330->y).n[0] = (psVar330->y).n[0] + auStack_438._0_8_;
        (psVar330->y).n[1] = uVar302 + auStack_438._8_8_;
        (psVar330->y).n[2] = uVar303 + auStack_438._16_8_;
        (psVar330->y).n[3] = uVar304 + auStack_438._24_8_;
        puVar323 = (psVar330->y).n + 4;
        *puVar323 = *puVar323 + auStack_438._32_8_;
        (psVar330->y).magnitude = iVar311;
        (psVar330->y).normalized = 0;
        psStack_4c0 = (secp256k1_gej *)0x124e69;
        secp256k1_fe_verify((secp256k1_fe *)psVar319);
        psStack_4c0 = (secp256k1_gej *)0x124e71;
        secp256k1_gej_verify(psVar330);
        return extraout_EAX;
      }
      goto LAB_00124f8a;
    }
  }
  else {
    psStack_4c0 = (secp256k1_gej *)0x124f4e;
    secp256k1_gej_add_var_cold_14();
LAB_00124f4e:
    psStack_4c0 = (secp256k1_gej *)0x124f53;
    secp256k1_gej_add_var_cold_13();
LAB_00124f53:
    psStack_4c0 = (secp256k1_gej *)0x124f58;
    secp256k1_gej_add_var_cold_12();
LAB_00124f58:
    psStack_4c0 = (secp256k1_gej *)0x124f5d;
    secp256k1_gej_add_var_cold_11();
LAB_00124f5d:
    psStack_4c0 = (secp256k1_gej *)0x124f62;
    secp256k1_gej_add_var_cold_10();
LAB_00124f62:
    psStack_4c0 = (secp256k1_gej *)0x124f67;
    secp256k1_gej_add_var_cold_9();
LAB_00124f67:
    psVar326 = psVar327;
    psVar320 = psVar330;
    psStack_4c0 = (secp256k1_gej *)0x124f6c;
    secp256k1_gej_add_var_cold_8();
LAB_00124f6c:
    psStack_4c0 = (secp256k1_gej *)0x124f71;
    secp256k1_gej_add_var_cold_7();
LAB_00124f71:
    psVar330 = psVar305;
    psVar328 = psVar326;
    psVar327 = psVar320;
    psStack_4c0 = (secp256k1_gej *)0x124f76;
    secp256k1_gej_add_var_cold_6();
LAB_00124f76:
    psStack_4c0 = (secp256k1_gej *)0x124f7b;
    secp256k1_gej_add_var_cold_5();
LAB_00124f7b:
    psStack_4c0 = (secp256k1_gej *)0x124f80;
    secp256k1_gej_add_var_cold_4();
LAB_00124f80:
    psStack_4c0 = (secp256k1_gej *)0x124f85;
    secp256k1_gej_add_var_cold_3();
  }
  psStack_4c0 = (secp256k1_gej *)0x124f8a;
  secp256k1_gej_add_var_cold_2();
LAB_00124f8a:
  psStack_4c0 = (secp256k1_gej *)secp256k1_ecmult_compute_table;
  secp256k1_gej_add_var_cold_1();
  psStack_4e0 = psVar319;
  psStack_4d8 = psVar327;
  psStack_4d0 = psVar328;
  psStack_4c8 = psVar318;
  psStack_4c0 = psVar330;
  memcpy(&sStack_578,psVar324,0x98);
  secp256k1_ge_set_gej_var(&sStack_5e0,&sStack_578);
  secp256k1_ge_to_storage((secp256k1_ge_storage *)psVar306,&sStack_5e0);
  secp256k1_gej_double_var(&sStack_578,psVar324,(secp256k1_fe *)0x0);
  secp256k1_ge_set_gej_var(&sStack_648,&sStack_578);
  lVar329 = 0x40;
  do {
    secp256k1_gej_set_ge(&sStack_578,&sStack_5e0);
    secp256k1_gej_add_ge_var(&sStack_578,&sStack_578,&sStack_648,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var(&sStack_5e0,&sStack_578);
    secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)(psVar306->x).n + lVar329),&sStack_5e0);
    lVar329 = lVar329 + 0x40;
  } while (lVar329 != 0x100);
  return extraout_EAX_02;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_is_square_var(const secp256k1_fe *x) {
    int ret;
    secp256k1_fe tmp = *x, sqrt;
    secp256k1_fe_verify(x);
    ret = secp256k1_fe_impl_is_square_var(x);
    secp256k1_fe_normalize_weak(&tmp);
    VERIFY_CHECK(ret == secp256k1_fe_sqrt(&sqrt, &tmp));
    return ret;
}